

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O1

string * __thiscall
CompoundExp::toString_abi_cxx11_(string *__return_storage_ptr__,CompoundExp *this)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  long *local_110;
  ulong local_108;
  long local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  long *local_b0;
  ulong local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  ulong local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  (*this->lhs->_vptr_Expression[3])(local_50);
  plVar2 = (long *)std::__cxx11::string::insert((ulong)local_50,0,'\x01');
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b0,local_a8,0,'\x01');
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(this->op)._M_dataplus._M_p);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_e0 = *puVar5;
    uStack_d8 = (undefined4)plVar2[3];
    uStack_d4 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar5;
    local_f0 = (ulong *)*plVar2;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (*this->rhs->_vptr_Expression[3])(&local_d0);
  uVar7 = 0xf;
  if (local_f0 != &local_e0) {
    uVar7 = local_e0;
  }
  if (uVar7 < (ulong)(local_c8 + local_e8)) {
    uVar7 = 0xf;
    if (local_d0 != local_c0) {
      uVar7 = local_c0[0];
    }
    if ((ulong)(local_c8 + local_e8) <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f0);
      goto LAB_001059d3;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_d0);
LAB_001059d3:
  local_110 = &local_100;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_100 = *plVar2;
    uStack_f8 = puVar3[3];
  }
  else {
    local_100 = *plVar2;
    local_110 = (long *)*puVar3;
  }
  local_108 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_110,local_108,0,'\x01');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar6) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompoundExp::toString() {
   return '(' + lhs->toString() + ' ' + op + ' ' + rhs->toString() + ')';
}